

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O1

ssize_t __thiscall GPIO::HitachiLCD::write(HitachiLCD *this,int __fd,void *__buf,size_t __n)

{
  RecursiveMutex *__mutex;
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  long lVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  wstring *__range1;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__fd);
  __mutex = &this->recursivemutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    lVar1 = plVar6[1];
    if (lVar1 != 0) {
      lVar2 = *plVar6;
      lVar5 = 0;
      __buf_00 = extraout_RDX;
      do {
        write(this,*(int *)(lVar2 + lVar5),__buf_00,__n);
        lVar5 = lVar5 + 4;
        __buf_00 = extraout_RDX_00;
      } while (lVar1 << 2 != lVar5);
    }
    lVar1 = plVar6[1];
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return lVar1;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

std::size_t HitachiLCD::write(const std::wstring& ws)
{
    RecursiveLock rlock(recursivemutex);
    for (auto ch : ws) write(ch);
    return ws.size();
}